

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O3

bool hashSearch<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,string *hash_str,string *map_name,string *default_value,uint8_t expansion,
               uint8_t reduction,bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  pointer piVar12;
  string *this;
  uint uVar13;
  uint32_t uVar14;
  int iVar15;
  ulong uVar16;
  size_t n;
  long *plVar17;
  uint uVar18;
  size_t sVar19;
  long *plVar20;
  uint uVar21;
  ulong uVar22;
  pointer pcVar23;
  ulong uVar24;
  undefined1 uVar25;
  size_type sVar26;
  long lVar27;
  uint8_t active_coeffs;
  byte bVar28;
  byte bVar29;
  bool bVar30;
  string upper_name;
  vector<int,_std::allocator<int>_> mapping;
  array<unsigned_int,_6UL> best_c;
  string local_1c8;
  string *local_1a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_1a0;
  ulong local_198;
  uint local_18c;
  uint local_188;
  uint local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  vector<int,_std::allocator<int>_> local_140;
  string *local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  string *local_118;
  size_type local_110;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<bool,_std::allocator<bool>_> local_58;
  
  puVar2 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar16 = (long)puVar3 - (long)puVar2 >> 1;
  local_1a0 = keys;
  if (uVar16 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x84,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  uVar22 = uVar16;
  if (uVar16 != 1 && puVar3 != puVar2) {
    do {
      uVar24 = uVar22;
      do {
        if (puVar2[uVar22 - 1] == puVar2[uVar24 - 2]) {
          __assert_fail("!hasDuplicates(keys)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                        ,0x85,
                        "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                       );
        }
        uVar24 = uVar24 - 1;
      } while (uVar24 != 1);
      bVar30 = uVar22 != 2;
      uVar22 = uVar22 - 1;
    } while (bVar30);
  }
  if ((long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 != uVar16) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x86,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  uVar25 = 0;
  n = getModulusBitmask((uVar16 * expansion) / (ulong)reduction);
  local_1c8._M_dataplus._M_p = local_1c8._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,n + 1,(bool *)&local_1c8,(allocator_type *)&local_160);
  uVar7 = c_max._M_elems[2];
  uVar6 = c_max._M_elems[1];
  c._M_elems[0] = c_min._M_elems[0];
  local_188 = c_max._M_elems[0];
  if (c_min._M_elems[0] <= c_max._M_elems[0]) {
    bVar29 = 7;
    local_18c = c_min._M_elems[1];
    local_180 = c_min._M_elems[2];
    uVar21 = c_min._M_elems[2];
    uVar18 = c_min._M_elems[0];
    local_1a8 = map_name;
    local_128 = default_value;
    local_120 = vals;
    local_118 = hash_str;
    local_110 = n + 1;
    do {
      uVar8 = c_max._M_elems[3];
      c._M_elems[1] = local_18c;
      local_184 = uVar18;
      if (local_18c <= uVar6) {
        local_178 = c_min._M_elems[3];
        uVar18 = local_18c;
        uVar13 = c_min._M_elems[3];
        do {
          uVar9 = c_max._M_elems[4];
          c._M_elems[2] = uVar21;
          local_17c = uVar18;
          if (uVar21 <= uVar7) {
            local_170 = c_min._M_elems[4];
            uVar18 = c_min._M_elems[4];
            do {
              uVar10 = c_max._M_elems[5];
              c._M_elems[3] = uVar13;
              local_174 = uVar21;
              if (uVar13 <= uVar8) {
                local_168 = c_min._M_elems[5];
                uVar21 = c_min._M_elems[5];
                do {
                  c._M_elems[4] = uVar18;
                  local_16c = uVar13;
                  uVar13 = uVar18;
                  uVar18 = local_170;
                  while (local_170 = uVar18, uVar13 <= uVar9) {
                    c._M_elems[5] = uVar21;
                    local_164 = uVar13;
                    p_Var4 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    while (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var4,
                          uVar21 <= uVar10) {
                      lVar27 = 5;
                      bVar28 = 0;
                      do {
                        bVar28 = (bVar28 + 1) - (c._M_elems[lVar27] == 0);
                        bVar30 = lVar27 != 0;
                        lVar27 = lVar27 + -1;
                      } while (bVar30);
                      if (bVar28 < bVar29) {
                        uVar16 = local_198 >> 8;
                        local_198 = CONCAT71((int7)uVar16,bVar29);
                        puVar2 = (local_1a0->
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        puVar3 = (local_1a0->
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                        sVar19 = n;
                        if (n != 0xffffffffffffffff) {
                          do {
                            uVar16 = sVar19 + 0x3f;
                            if (-1 < (long)sVar19) {
                              uVar16 = sVar19;
                            }
                            bVar29 = (byte)sVar19 & 0x3f;
                            p_Var4[((long)uVar16 >> 6) +
                                   ((ulong)((sVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)
                                  ] = p_Var4[((long)uVar16 >> 6) +
                                             ((ulong)((sVar19 & 0x800000000000003f) <
                                                     0x8000000000000001) - 1)] &
                                      (-2L << bVar29 | 0xfffffffffffffffeU >> 0x40 - bVar29);
                            bVar30 = sVar19 != 0;
                            sVar19 = sVar19 - 1;
                          } while (bVar30);
                        }
                        lVar27 = (long)puVar3 - (long)puVar2;
                        if (lVar27 != 0) {
                          lVar27 = lVar27 >> 1;
                          do {
                            uVar14 = hash((uint)puVar2[lVar27 + -1]);
                            uVar18 = uVar14 & (uint)n;
                            if ((p_Var4[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1) != 0) {
                              bVar29 = (byte)local_198;
                              goto LAB_0010e4c7;
                            }
                            lVar27 = lVar27 + -1;
                            p_Var4[uVar18 >> 6] = 1L << ((byte)uVar18 & 0x3f) | p_Var4[uVar18 >> 6];
                          } while (lVar27 != 0);
                        }
                        local_78[0] = c._M_elems[4];
                        local_78[1] = c._M_elems[5];
                        local_88[0] = c._M_elems[0];
                        local_88[1] = c._M_elems[1];
                        auStack_80[0] = c._M_elems[2];
                        auStack_80[1] = c._M_elems[3];
                        bVar29 = bVar28;
                      }
LAB_0010e4c7:
                      uVar21 = uVar21 + 1;
                      c._M_elems[5] = uVar21;
                      p_Var4 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    }
                    uVar13 = local_164 + 1;
                    c._M_elems[4] = uVar13;
                    uVar21 = local_168;
                    uVar18 = local_170;
                  }
                  uVar13 = local_16c + 1;
                  c._M_elems[3] = uVar13;
                } while (uVar13 <= uVar8);
              }
              uVar21 = local_174 + 1;
              c._M_elems[2] = uVar21;
              uVar13 = local_178;
            } while (uVar21 <= uVar7);
          }
          uVar18 = local_17c + 1;
          c._M_elems[1] = uVar18;
          uVar21 = local_180;
        } while (uVar18 <= uVar6);
      }
      uVar18 = local_184 + 1;
      c._M_elems[0] = uVar18;
    } while (uVar18 <= local_188);
    if (bVar29 == 7) {
      uVar25 = 0;
    }
    else {
      c._M_elems[4] = local_78[0];
      c._M_elems[5] = local_78[1];
      c._M_elems[0] = local_88[0];
      c._M_elems[1] = local_88[1];
      c._M_elems[2] = auStack_80[0];
      c._M_elems[3] = auStack_80[1];
      local_1c8._M_dataplus._M_p._0_4_ = 0xffffffff;
      local_198 = (ulong)CONCAT31((int3)(uVar18 >> 8),bVar29 != 7);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_140,local_110,(value_type_conflict4 *)&local_1c8,
                 (allocator_type *)&local_160);
      this = local_118;
      piVar12 = local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (local_1a0->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar27 = (long)(local_1a0->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
      if (lVar27 != 0) {
        lVar27 = lVar27 >> 1;
        do {
          lVar5 = lVar27 + -1;
          lVar27 = lVar27 + -1;
          uVar14 = hash((uint)puVar2[lVar5]);
          piVar12[uVar14 & (uint)n] = (int)lVar27;
        } while (lVar27 != 0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_70,local_120);
      pcVar23 = (local_1a8->_M_dataplus)._M_p;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar23,pcVar23 + local_1a8->_M_string_length);
      getCommonCodeGen<unsigned_short>
                (&local_1c8,local_1a0,&local_70,&local_140,n,&local_e8,nonKeyLookups);
      std::__cxx11::string::operator=((string *)this,(string *)&local_1c8);
      paVar1 = &local_1c8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
      pcVar23 = (local_1a8->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar23,pcVar23 + local_1a8->_M_string_length);
      local_a8.field_2._M_allocated_capacity = 0x745f3631746e6975;
      local_a8._M_string_length = 8;
      local_a8.field_2._M_local_buf[8] = '\0';
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      hashStr(&local_1c8,(uint32_t)pcVar23,n,local_128,&local_108,&local_a8,nonKeyLookups);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar23 = (local_1a8->_M_dataplus)._M_p;
      local_1c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar23,pcVar23 + local_1a8->_M_string_length);
      _Var11._M_p = local_1c8._M_dataplus._M_p;
      if (local_1c8._M_string_length != 0) {
        sVar26 = 0;
        do {
          iVar15 = toupper((int)_Var11._M_p[sVar26]);
          _Var11._M_p[sVar26] = (char)iVar15;
          sVar26 = sVar26 + 1;
        } while (local_1c8._M_string_length != sVar26);
      }
      std::operator+(&local_c8,"#endif // POIFECT_",&local_1c8);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_c8);
      plVar20 = plVar17 + 2;
      if ((long *)*plVar17 == plVar20) {
        local_150 = *plVar20;
        lStack_148 = plVar17[3];
        local_160 = &local_150;
      }
      else {
        local_150 = *plVar20;
        local_160 = (long *)*plVar17;
      }
      local_158 = plVar17[1];
      *plVar17 = (long)plVar20;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::_M_append((char *)this,(ulong)local_160);
      uVar25 = (undefined1)local_198;
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (bool)uVar25;
}

Assistant:

bool hashSearch(const std::vector<KeyType>& keys,
                const std::vector<std::string>& vals,
                std::string& hash_str,
                std::string map_name = "PoifectMap",
                std::string default_value = "",
                uint8_t expansion = 1,
                uint8_t reduction = 1,
                bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    size_t n = getModulusBitmask(keys.size() * expansion / reduction);
    std::vector<bool> hash_table(n+1, false);
    uint8_t best_num_c = c.size()+1;
    std::array<uint32_t, c.size()> best_c;

    #define ITERATE_INDEX(i) for(c[i] = c_min[i]; c[i] <= c_max[i]; c[i]++)

    ITERATE_INDEX(0)
    ITERATE_INDEX(1)
    ITERATE_INDEX(2)
    ITERATE_INDEX(3)
    ITERATE_INDEX(4)
    ITERATE_INDEX(5)
    {
        const uint8_t num_c = checkNonzeroCoeffs();
        if(num_c < best_num_c && !hasCollisions(keys, n, hash_table)){
            best_num_c = num_c;
            best_c = c;
        }
    }

    if(best_num_c == c.size()+1) return false;

    c = best_c;
    std::vector<int> mapping(n+1, -1);
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        mapping[hash(keys[i])&n] = i;

    hash_str = getCommonCodeGen(keys, vals, mapping, n, map_name, nonKeyLookups);

    hash_str += hashStr(keys[0], n, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";

    return true;
}